

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-get-attr.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint *dtype;
  int iVar1;
  uint uVar2;
  int iVar3;
  BigAttr *pBVar4;
  char *pcVar5;
  char **ppcVar6;
  BigBlock *block;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char acStack_160 [140];
  int iStack_d4;
  char **ppcStack_d0;
  ulong uStack_c8;
  undefined1 auStack_98 [8];
  BigBlock bb;
  ulong local_40;
  size_t nattr;
  BigFile bf;
  
  nattr = 0;
  bb.Nfile = 0;
  bb._60_4_ = 0;
  bb.attrset = (BigAttrSet *)0x0;
  bb.foffset = (size_t *)0x0;
  bb.fchecksum = (uint *)0x0;
  bb.size = 0;
  bb.fsize = (size_t *)0x0;
  bb.nmemb = 0;
  bb._12_4_ = 0;
  bb.basename = (char *)0x0;
  auStack_98[0] = '\0';
  auStack_98[1] = '\0';
  auStack_98[2] = '\0';
  auStack_98[3] = '\0';
  auStack_98[4] = '\0';
  auStack_98[5] = '\0';
  auStack_98[6] = '\0';
  auStack_98[7] = '\0';
  bb.dtype[0] = '\0';
  bb.dtype[1] = '\0';
  bb.dtype[2] = '\0';
  bb.dtype[3] = '\0';
  bb.dtype[4] = '\0';
  bb.dtype[5] = '\0';
  bb.dtype[6] = '\0';
  bb.dtype[7] = '\0';
  while( true ) {
    ppcVar6 = argv;
    iVar1 = getopt(argc,argv,"l");
    iVar3 = (int)ppcVar6;
    if (iVar1 != 0x6c) break;
    longfmt = 1;
  }
  if (iVar1 == -1) {
    if (argc - _optind < 2) goto LAB_0010260d;
    argv = argv + _optind;
    pcVar9 = *argv;
    iVar1 = big_file_open((BigFile *)&nattr,pcVar9);
    iVar3 = (int)pcVar9;
    if (iVar1 == 0) {
      block = (BigBlock *)auStack_98;
      iVar1 = big_file_open_block((BigFile *)&nattr,block,argv[1]);
      iVar3 = (int)block;
      if (iVar1 == 0) {
        if (argc - _optind == 2) {
          pBVar4 = big_block_list_attrs((BigBlock *)auStack_98,&local_40);
          if (local_40 != 0) {
            uVar7 = 0;
            do {
              print_attr(pBVar4,0);
              uVar7 = uVar7 + 1;
              pBVar4 = pBVar4 + 1;
            } while (uVar7 < local_40);
          }
        }
        if (2 < argc - _optind) {
          lVar8 = 2;
          do {
            pBVar4 = big_block_lookup_attr((BigBlock *)auStack_98,argv[lVar8]);
            if (pBVar4 == (BigAttr *)0x0) {
              printf("%s, not attr:\n",argv[lVar8]);
            }
            else {
              print_attr(pBVar4,(uint)(argc - _optind == 3));
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (long)argc - (long)_optind);
        }
        big_block_close((BigBlock *)auStack_98);
        big_file_close((BigFile *)&nattr);
        return 0;
      }
      goto LAB_0010261a;
    }
  }
  else {
    main_cold_4();
LAB_0010260d:
    main_cold_3();
  }
  main_cold_1();
LAB_0010261a:
  ppcVar6 = argv + 1;
  main_cold_2();
  pcVar9 = ppcVar6[3];
  iStack_d4 = iVar3;
  ppcStack_d0 = ppcVar6;
  uStack_c8 = (ulong)(uint)argc;
  if ((iVar3 == 0) || (longfmt != 0)) {
    printf("%-20s %s %3d  ",ppcVar6[2],(uint *)((long)ppcVar6 + 4),(ulong)*(uint *)ppcVar6);
    printf("[ ");
  }
  uVar2 = *(uint *)ppcStack_d0;
  if (0 < (int)uVar2) {
    dtype = (uint *)((long)ppcStack_d0 + 4);
    iVar1 = 0;
    do {
      if ((iVar1 == uVar2 - 1) || (pcVar5 = " ", *(char *)((long)ppcStack_d0 + 5) == 'S')) {
        pcVar5 = "";
      }
      big_file_dtype_format(acStack_160,(char *)dtype,pcVar9,(char *)0x0);
      printf("%s%s",acStack_160,pcVar5);
      iVar3 = big_file_dtype_itemsize((char *)dtype);
      pcVar9 = pcVar9 + iVar3;
      iVar1 = iVar1 + 1;
      uVar2 = *(uint *)ppcStack_d0;
    } while (iVar1 < (int)uVar2);
  }
  if ((iStack_d4 == 0) || (longfmt != 0)) {
    printf(" ]");
  }
  iVar1 = putchar(10);
  return iVar1;
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};

    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt) {
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    argv += optind - 1;
    if(argc - optind < 2) {
        usage();
    }

    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open file : %s %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open block: %s %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    int i; 
    if(argc - optind == 2) {
        size_t nattr;
        BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
        for(i = 0; i < nattr; i ++) {
            BigAttr * attr = &attrs[i];
            print_attr(attr, 0);
        }
    }
    for(i = 3; i < argc - optind + 1; i ++) {
        BigAttr * attr = big_block_lookup_attr(&bb, argv[i]);
        if(attr) {
            print_attr(attr, argc - optind == 3);
        } else {
            printf("%s, not attr:\n", argv[i]);
        }
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}